

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t FNV1A_Pippip_Yurii(char *key,int wrdlen,uint32_t seed)

{
  uint uVar1;
  size_t sVar2;
  size_t NDhead;
  size_t Cycles;
  uint64_t hash64;
  uint32_t hash32;
  uint32_t PRIME;
  char *str;
  uint32_t seed_local;
  int wrdlen_local;
  char *key_local;
  
  hash64 = (ulong)seed ^ 0xcbf29ce484222325;
  if (wrdlen < 9) {
    hash64 = (hash64 ^ (ulong)(*(long *)key << (('\b' - (char)wrdlen) * '\b' & 0x3fU)) >>
                       (('\b' - (char)wrdlen) * '\b' & 0x3fU)) * 0x23462239;
  }
  else {
    sVar2 = (size_t)((wrdlen + -1 >> 4) + 1);
    Cycles = sVar2;
    str = key;
    while (Cycles != 0) {
      hash64 = ((hash64 ^ *(ulong *)str) * 0x23462239 ^ *(ulong *)(str + (long)wrdlen + sVar2 * -8))
               * 0x23462239;
      str = str + 8;
      Cycles = Cycles - 1;
    }
  }
  uVar1 = (uint)hash64 ^ (uint)(hash64 >> 0x20);
  return uVar1 ^ uVar1 >> 0x10;
}

Assistant:

uint32_t
FNV1A_Pippip_Yurii(const char *key, int wrdlen, uint32_t seed)
{
#define _PADr_KAZE(x, n) ( ((x) << (n))>>(n) )
  const char *str = (char *)key;
  const uint32_t PRIME = 591798841;
  uint32_t hash32;
  uint64_t hash64 = (uint64_t)seed ^ UINT64_C(14695981039346656037);
  size_t Cycles, NDhead;
  if (wrdlen > 8) {
    Cycles = ((wrdlen - 1) >> 4) + 1;
    NDhead = wrdlen - (Cycles << 3);
#pragma nounroll
    for (; Cycles--; str += 8) {
      hash64 = (hash64 ^ (*(uint64_t *)(str))) * PRIME;
      hash64 = (hash64 ^ (*(uint64_t *)(str + NDhead))) * PRIME;
    }
  } else {
    hash64 = (hash64 ^ _PADr_KAZE(*(uint64_t *)(str + 0), (8 - wrdlen) << 3)) *
             PRIME;
  }
  hash32 = (uint32_t)(hash64 ^ (hash64 >> 32));
  return hash32 ^ (hash32 >> 16);
#undef _PADr_KAZE
}